

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::Write_1(ON_Mesh *this,ON_BinaryArchive *file)

{
  bool local_19;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_Mesh *this_local;
  
  local_19 = ON_BinaryArchive::WriteArray(file,&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  if (local_19) {
    local_19 = ON_BinaryArchive::WriteArray(file,&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteArray(file,&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteArray(file,&this->m_K);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::WriteArray(file,&this->m_C);
  }
  return local_19;
}

Assistant:

bool ON_Mesh::Write_1( ON_BinaryArchive& file ) const
{
  // ver 1.0 uncompressed format

  bool rc = file.WriteArray( m_V );
  if (rc) rc = file.WriteArray( m_N );
  if (rc) rc = file.WriteArray( m_T );
  if (rc) rc = file.WriteArray( m_K );
  if (rc) rc = file.WriteArray( m_C );

  return rc;
}